

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  undefined8 *puVar1;
  long lVar2;
  ctrl_t *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  uintptr_t v;
  ulong uVar6;
  uintptr_t v_3;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t hash;
  size_t sVar7;
  undefined8 *puVar8;
  ctrl_t cVar9;
  ulong uVar10;
  ulong uVar11;
  FindInfo FVar12;
  HashSetResizeHelper resize_helper;
  undefined1 local_52;
  undefined1 local_51;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  undefined2 local_37;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_40 = common->capacity_;
    local_38 = (byte)common->size_ & 1;
    local_37 = 0;
    local_50.heap.control = (common->heap_or_soo_).heap.control;
    local_50.heap.slot_array = (MaybeInitializedPtr)(common->heap_or_soo_).heap.slot_array.p;
    CommonFields::set_capacity(common,new_capacity);
    bVar5 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,24ul,false,false,8ul>
                      ((HashSetResizeHelper *)&local_50,common,&local_51,0xffffff80,0x10,0x18);
    if (local_40 != 0) {
      if (bVar5) {
        HashSetResizeHelper::
        GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>,void>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>
                  ((HashSetResizeHelper *)&local_50.heap,common,
                   (allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>
                    *)common);
      }
      else {
        if ((char)local_37 == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_40 != 0) {
          lVar2 = *(long *)((long)&common->heap_or_soo_ + 8);
          puVar8 = (undefined8 *)((long)local_50.heap.slot_array + 0x10);
          sVar7 = 0;
          hash = extraout_RDX;
          do {
            if ((char)local_37 == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_50.heap.control[sVar7]) {
              uVar10 = (puVar8[-2] ^ (ulong)&hash_internal::MixingHashState::kSeed) *
                       -0x234dd359734ecb13;
              uVar10 = ((uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                         (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                         (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                         (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38) ^ puVar8[-2]) *
                       -0x234dd359734ecb13;
              uVar10 = ((uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                         (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                         (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                         (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38) ^ puVar8[-1]) *
                       -0x234dd359734ecb13;
              uVar11 = ((uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                         (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                         (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                         (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38) ^ puVar8[-1]) *
                       -0x234dd359734ecb13;
              FVar12 = find_first_non_full<void>
                                 ((container_internal *)common,
                                  (CommonFields *)
                                  (uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                                   (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8
                                   | (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                                   (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38),hash);
              uVar6 = FVar12.offset;
              uVar10 = common->capacity_;
              if (uVar10 <= uVar6) {
                __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x744,
                              "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                             );
              }
              cVar9 = (ctrl_t)(uVar11 >> 0x38) & ~kEmpty;
              pcVar3 = (common->heap_or_soo_).heap.control;
              pcVar3[uVar6] = cVar9;
              pcVar3[(ulong)((uint)uVar10 & 0xf) + (uVar6 - 0xf & uVar10)] = cVar9;
              common->capacity_ = 0xffffffffffffff9c;
              uVar4 = puVar8[-1];
              puVar1 = (undefined8 *)(lVar2 + uVar6 * 0x18);
              *puVar1 = puVar8[-2];
              puVar1[1] = uVar4;
              *(undefined8 *)(lVar2 + 0x10 + uVar6 * 0x18) = *puVar8;
              *puVar8 = 0;
              CommonFields::set_capacity(common,uVar10);
              hash = extraout_RDX_00;
            }
            sVar7 = sVar7 + 1;
            puVar8 = puVar8 + 3;
          } while (sVar7 != local_40);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_50,&local_52,0x18);
    }
    return;
  }
  __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe92,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, absl::hash_internal::Hash<std::pair<const void *, const void *>>, std::equal_to<std::pair<const void *, const void *>>, std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>, Hash = absl::hash_internal::Hash<std::pair<const void *, const void *>>, Eq = std::equal_to<std::pair<const void *, const void *>>, Alloc = std::allocator<std::pair<const std::pair<const void *, const void *>, std::unique_ptr<google::protobuf::DescriptorPool::MemoBase>>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }